

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskGen.cpp
# Opt level: O1

AutorunType __thiscall DiskGen::GetAutorun(DiskGen *this,char *buffer,uint size_of_buffer)

{
  char *pcVar1;
  bool bVar2;
  char **__s1;
  AutorunType AVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  pointer pRVar8;
  char *pcVar9;
  pointer pbVar10;
  pointer pbVar11;
  bool bVar12;
  bool bVar13;
  vector<Rule,_std::allocator<Rule>_> rule_list;
  AutorunType ret;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filename_vector;
  string disk_filename;
  int local_e0;
  vector<Rule,_std::allocator<Rule>_> local_d8;
  value_type local_b8;
  pointer local_98;
  pointer local_90;
  AutorunType local_84;
  char *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  pointer local_60;
  pointer local_58;
  long *local_50;
  int local_48;
  long local_40 [2];
  
  local_80 = buffer;
  IDisk::GetCAT_abi_cxx11_(&local_78,this->disk_,&local_84,0);
  if (this->disk_ == (IDisk *)0x0) {
    pcVar9 = "";
  }
  else {
    pcVar9 = (this->disk_->current_disk_path_)._M_dataplus._M_p;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,pcVar9,(allocator<char> *)&local_d8);
  local_d8.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_d8.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_d8.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8.name_._0_5_ = 0x1a7694;
  local_b8._5_4_ = 0x24000000;
  local_b8.ext_._1_4_ = 0x1a8d;
  local_b8.ext_._5_2_ = 0;
  local_b8.ext_._7_1_ = 0;
  local_b8.autofile_ = "DISC";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_d8,&local_b8);
  local_b8.name_._0_5_ = 0x1a769e;
  local_b8._5_4_ = 0x24000000;
  local_b8.ext_._1_4_ = 0x1a8d;
  local_b8.ext_._5_2_ = 0;
  local_b8.ext_._7_1_ = 0;
  local_b8.autofile_ = "DISK";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_d8,&local_b8);
  local_b8.name_._0_5_ = 0x1a7694;
  local_b8._5_4_ = 0xa8000000;
  local_b8.ext_._1_4_ = 0x1a76;
  local_b8.ext_._5_2_ = 0;
  local_b8.ext_._7_1_ = 0;
  local_b8.autofile_ = "DISC";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_d8,&local_b8);
  local_b8.name_._0_5_ = 0x1a769e;
  local_b8._5_4_ = 0xa8000000;
  local_b8.ext_._1_4_ = 0x1a76;
  local_b8.ext_._5_2_ = 0;
  local_b8.ext_._7_1_ = 0;
  local_b8.autofile_ = "DISK";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_d8,&local_b8);
  local_b8.name_._0_5_ = 0x1a76ac;
  local_b8._5_4_ = 0x24000000;
  local_b8.ext_._1_4_ = 0x1a8d;
  local_b8.ext_._5_2_ = 0;
  local_b8.ext_._7_1_ = 0;
  local_b8.autofile_ = "ELITE";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_d8,&local_b8);
  local_b8.name_._0_5_ = 0x1a76ac;
  local_b8._5_4_ = 0xa8000000;
  local_b8.ext_._1_4_ = 0x1a76;
  local_b8.ext_._5_2_ = 0;
  local_b8.ext_._7_1_ = 0;
  local_b8.autofile_ = "ELITE";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_d8,&local_b8);
  local_b8.name_._0_5_ = 0x1a76b8;
  local_b8._5_4_ = 0x24000000;
  local_b8.ext_._1_4_ = 0x1a8d;
  local_b8.ext_._5_2_ = 0;
  local_b8.ext_._7_1_ = 0;
  local_b8.autofile_ = "UBI";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_d8,&local_b8);
  local_b8.name_._0_5_ = 0x1a76b8;
  local_b8._5_4_ = 0xa8000000;
  local_b8.ext_._1_4_ = 0x1a76;
  local_b8.ext_._5_2_ = 0;
  local_b8.ext_._7_1_ = 0;
  local_b8.autofile_ = "UBI";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_d8,&local_b8);
  local_b8.name_._0_5_ = 0x1a76b8;
  local_b8._5_4_ = 0xf3000000;
  local_b8.ext_._1_4_ = 0x1aa5;
  local_b8.ext_._5_2_ = 0;
  local_b8.ext_._7_1_ = 0;
  local_b8.autofile_ = "UBI";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_d8,&local_b8);
  local_b8.name_._0_5_ = 0x1a76c0;
  local_b8._5_4_ = 0x24000000;
  local_b8.ext_._1_4_ = 0x1a8d;
  local_b8.ext_._5_2_ = 0;
  local_b8.ext_._7_1_ = 0;
  local_b8.autofile_ = "ERE.BAS";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_d8,&local_b8);
  local_b8.name_._0_5_ = 0x1a76c0;
  local_b8._5_4_ = 0xa8000000;
  local_b8.ext_._1_4_ = 0x1a76;
  local_b8.ext_._5_2_ = 0;
  local_b8.ext_._7_1_ = 0;
  local_b8.autofile_ = "ERE.BAS";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_d8,&local_b8);
  local_b8.name_._0_5_ = 0x1a76cc;
  local_b8._5_4_ = 0x24000000;
  local_b8.ext_._1_4_ = 0x1a8d;
  local_b8.ext_._5_2_ = 0;
  local_b8.ext_._7_1_ = 0;
  local_b8.autofile_ = "MBC";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_d8,&local_b8);
  local_b8.name_._0_5_ = 0x1a76cc;
  local_b8._5_4_ = 0xa8000000;
  local_b8.ext_._1_4_ = 0x1a76;
  local_b8.ext_._5_2_ = 0;
  local_b8.ext_._7_1_ = 0;
  local_b8.autofile_ = "MBC";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_d8,&local_b8);
  local_b8.name_._0_5_ = 0x1a76d4;
  local_b8._5_4_ = 0xa8000000;
  local_b8.ext_._1_4_ = 0x1a76;
  local_b8.ext_._5_2_ = 0;
  local_b8.ext_._7_1_ = 0;
  local_b8.autofile_ = "ESAT";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_d8,&local_b8);
  local_b8.name_._0_5_ = 0x1a76d4;
  local_b8._5_4_ = 0x24000000;
  local_b8.ext_._1_4_ = 0x1a8d;
  local_b8.ext_._5_2_ = 0;
  local_b8.ext_._7_1_ = 0;
  local_b8.autofile_ = "ESAT";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_d8,&local_b8);
  local_b8.name_._0_5_ = 0x1a76d4;
  local_b8._5_4_ = 0xf3000000;
  local_b8.ext_._1_4_ = 0x1aa5;
  local_b8.ext_._5_2_ = 0;
  local_b8.ext_._7_1_ = 0;
  local_b8.autofile_ = "ESAT";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_d8,&local_b8);
  local_b8.name_._0_5_ = 0x1a76de;
  local_b8._5_4_ = 0x24000000;
  local_b8.ext_._1_4_ = 0x1a8d;
  local_b8.ext_._5_2_ = 0;
  local_b8.ext_._7_1_ = 0;
  local_b8.autofile_ = "JEU";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_d8,&local_b8);
  local_b8.name_._0_5_ = 0x1a76de;
  local_b8._5_4_ = 0xa8000000;
  local_b8.ext_._1_4_ = 0x1a76;
  local_b8.ext_._5_2_ = 0;
  local_b8.ext_._7_1_ = 0;
  local_b8.autofile_ = "JEU";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_d8,&local_b8);
  pbVar11 = local_78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_98 = local_d8.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_60 = local_d8.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.
             super__Vector_impl_data._M_start;
  pRVar8 = local_d8.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_d8.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_d8.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    bVar13 = true;
    bVar2 = false;
  }
  else {
    bVar12 = local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_90 = local_78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_58 = local_78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
    bVar2 = false;
    do {
      bVar13 = bVar12;
      if (local_90 != pbVar11) {
        pcVar9 = pRVar8->name_;
        pcVar1 = pRVar8->ext_;
        bVar4 = CompareStringFromCat((local_90->_M_dataplus)._M_p,pcVar9,pcVar1);
        for (pbVar10 = local_58; (!bVar4 && (bVar13 = pbVar10 != pbVar11, bVar13));
            pbVar10 = pbVar10 + 1) {
          bVar4 = CompareStringFromCat((pbVar10->_M_dataplus)._M_p,pcVar9,pcVar1);
        }
      }
      if (bVar13) {
        strcpy(local_80,pRVar8->autofile_);
        bVar2 = true;
      }
      pRVar8 = pRVar8 + 1;
      bVar13 = !bVar2;
    } while ((pRVar8 != local_98) && (!bVar2));
  }
  if ((bVar13) &&
     (local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    __s1 = &local_b8.ext_;
    local_90 = (pointer)CONCAT71(local_90._1_7_,1);
    local_98 = (pointer)((ulong)local_98 & 0xffffffff00000000);
    local_e0 = 0;
    pbVar11 = local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar9 = (pbVar11->_M_dataplus)._M_p;
      local_b8.ext_._7_1_ = 0;
      local_b8.ext_._5_2_ = 0;
      local_b8.name_._0_5_ = (undefined5)*(undefined8 *)pcVar9;
      local_b8.ext_._0_1_ = (undefined1)((ulong)*(undefined8 *)(pcVar9 + 5) >> 0x18);
      local_b8.name_._5_3_ = (undefined3)((ulong)*(undefined8 *)pcVar9 >> 0x28);
      local_b8.ext_._1_4_ = (uint)((ulong)*(undefined8 *)(pcVar9 + 5) >> 0x20) & 0xffffff7f;
      local_b8._5_4_ = CONCAT13(local_b8.ext_._0_1_,local_b8.name_._5_3_) & 0x7fffffff;
      iVar5 = strncasecmp((char *)__s1,"bin",3);
      if (((iVar5 == 0) || (iVar5 = strncasecmp((char *)__s1,"bas",3), iVar5 == 0)) ||
         (iVar5 = strncasecmp((char *)__s1,"   ",3), iVar5 == 0)) {
        iVar5 = NbIdenticalCar(pcVar9,(char *)local_50,local_48);
        iVar6 = strncmp(pcVar9 + 8,"BIN",3);
        if ((iVar6 == 0) || (iVar6 = strncmp(pcVar9 + 8,"BAS",3), iVar6 == 0)) {
          pRVar8 = (pointer)CONCAT71((int7)((ulong)pRVar8 >> 8),1);
        }
        else {
          pRVar8 = (pointer)0x0;
        }
        pcVar1 = local_80;
        if ((((local_e0 == 0 || local_e0 < iVar5) ||
             ((((ulong)local_90 & 1) != 0 && (-1 < pcVar9[9])))) ||
            ((((ulong)local_98 & 1) == 0 & (byte)pRVar8) == 1)) &&
           (((((ulong)local_90 & 1) != 0 || (-1 < pcVar9[9])) &&
            (((byte)pRVar8 != 0 || (((ulong)local_98 & 1) == 0)))))) {
          local_90 = (pointer)CONCAT71(local_90._1_7_,(byte)pcVar9[9] >> 7);
          sprintf(local_80,"%8.8s",pcVar9);
          uVar7 = 7;
          do {
            if (pcVar1[uVar7] != ' ') break;
            pcVar1[uVar7] = '\0';
            bVar13 = uVar7 != 0;
            uVar7 = uVar7 - 1;
          } while (bVar13);
          local_98 = (pointer)CONCAT44(local_98._4_4_,(int)pRVar8);
          local_e0 = iVar5;
        }
      }
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 !=
             local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((bVar2) || (*local_80 != '\0')) {
    local_84 = AUTO_FILE;
  }
  AVar3 = local_84;
  if (local_60 != (pointer)0x0) {
    operator_delete(local_60,(long)local_d8.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)local_60);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return AVar3;
}

Assistant:

IDisk::AutorunType DiskGen::GetAutorun(char* buffer, unsigned int size_of_buffer)
{
   IDisk::AutorunType ret;
   bool end = false;
   int nb_correct_char = 0;
   bool correct_hidden = 1;

   std::vector<std::string> filename_vector = disk_->GetCAT(ret);

   // Get disk name
   std::string disk_filename = GetCurrentLoadedDisk();

   // Specific rules : for specific disks !
   //todo

   // Generic Rules
   class Rule
   {
   public:
      Rule(const char* name, const char* ext, const char* autofile) : name_(name), ext_(ext), autofile_(autofile)
      {
      }

      const char* name_;
      const char* ext_;
      const char* autofile_;
   };

   std::vector<Rule> rule_list;
   rule_list.push_back(Rule("disc", "bin", "DISC"));
   rule_list.push_back(Rule("disk", "bin", "DISK"));
   rule_list.push_back(Rule("disc", "bas", "DISC"));
   rule_list.push_back(Rule("disk", "bas", "DISK"));
   rule_list.push_back(Rule("elite", "bin", "ELITE"));
   rule_list.push_back(Rule("elite", "bas", "ELITE"));
   rule_list.push_back(Rule("ubi", "bin", "UBI"));
   rule_list.push_back(Rule("ubi", "bas", "UBI"));
   rule_list.push_back(Rule("ubi", "", "UBI"));
   rule_list.push_back(Rule("ere", "bin", "ERE.BAS"));
   rule_list.push_back(Rule("ere", "bas", "ERE.BAS"));
   rule_list.push_back(Rule("mbc", "bin", "MBC"));
   rule_list.push_back(Rule("mbc", "bas", "MBC"));
   rule_list.push_back(Rule("esat", "bas", "ESAT"));
   rule_list.push_back(Rule("esat", "bin", "ESAT"));
   rule_list.push_back(Rule("esat", "", "ESAT"));
   rule_list.push_back(Rule("jeu", "bin", "JEU"));
   rule_list.push_back(Rule("jeu", "bas", "JEU"));

   for (auto it = rule_list.begin(); it != rule_list.end() && (end == false); it++)
   {
      if (FindName(filename_vector, it->name_, it->ext_))
      {
         strcpy(buffer, it->autofile_);
         end = true;
      }
   }

   // Other rules
   bool ext_binbas = false;

   if (end == false)
   {
      for (auto it = filename_vector.begin(); it != filename_vector.end(); it++)
      {
         unsigned char filename[16] = {0};
         memcpy(filename, it->c_str(), 13);
         filename[9] = filename[9] & 0x7F; // READ ONLY
         filename[8] = filename[8] & 0x7F; // HIDDEN / SYSTEM
         bool bnewbinbas = false;
         if (strnicmp((char*)&filename[8], "bin", 3) == 0
            || strnicmp((char*)&filename[8], "bas", 3) == 0
            || strnicmp((char*)&filename[8], "   ", 3) == 0)
         {
            // Priority : If it's call "sav?????.b??", it's less priority thant any other
            int nbcar = NbIdenticalCar(it->c_str(), disk_filename.c_str(), disk_filename.size());
            if (strncmp(&it->c_str()[8], "BIN", 3) == 0
               || strncmp(&it->c_str()[8], "BAS", 3) == 0
            )
               bnewbinbas = true;
            if (nbcar > nb_correct_char || nb_correct_char == 0 || (correct_hidden == true && ((it->c_str()[9] & 0x80)
               == 0)) || (bnewbinbas == true && ext_binbas == false))
            {
               if (correct_hidden == false && (it->c_str()[9] & 0x80) == 0x80)
               {
               }
               else if (bnewbinbas == false && ext_binbas == true)
               {
               }
               else
               {
                  // Update return;
                  nb_correct_char = nbcar;
                  ext_binbas = bnewbinbas;

                  correct_hidden = it->c_str()[9] & 0x80;
                  sprintf(buffer, "%8.8s", it->c_str() /*, (char*)&pTrackData[offset+8]*/);
                  for (int i = 7; i >= 0; i--)
                  {
                     if (buffer[i] == 0x20) buffer[i] = 0x00;
                     else break;
                  }
               }
            }
         }
      }
   }

   if (end || strlen(buffer) > 0)
      ret = IDisk::AUTO_FILE;

   return ret;
}